

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O3

void Eigen::internal::LU_kernel_bmod<-1>::
     run<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int segsize,
               Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *tempv,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  double *local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
  *local_d8;
  double *local_d0;
  long local_c8;
  long local_b8;
  double *local_b0;
  long local_a8;
  double *local_a0;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> u;
  
  iVar17 = lptr + no_zeros;
  lVar16 = (long)iVar17;
  if (0 < segsize) {
    pdVar2 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar12 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    uVar11 = 0;
    if ((long)uVar12 < 1) {
      uVar12 = uVar11;
    }
    lVar5 = *(long *)&dense->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    piVar3 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    do {
      if ((iVar17 < 0) ||
         ((lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(lVar16 + uVar11))) goto LAB_001577c6;
      lVar15 = (long)piVar3[lVar16 + uVar11];
      if ((lVar15 < 0) ||
         (*(long *)&(dense->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8 <= lVar15)) goto LAB_001577af;
      if (uVar12 == uVar11) goto LAB_001577dd;
      pdVar2[uVar11] = *(double *)(lVar5 + lVar15 * 8);
      uVar11 = uVar11 + 1;
    } while ((uint)segsize != uVar11);
  }
  lVar5 = (long)((lda + 1) * no_zeros) + (long)*luptr;
  *luptr = (int)lVar5;
  if (lda < 0) {
LAB_0015781b:
    __assert_fail("innerStride>=0 && outerStride>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Stride.h"
                  ,0x40,
                  "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
                 );
  }
  pdVar2 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (-1 < segsize || pdVar2 == (double *)0x0) {
    lVar15 = (long)segsize;
    local_a0 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    u._0_8_ = lVar15;
    if (segsize < 0) {
      pcVar9 = 
      "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
      ;
    }
    else {
      local_100 = pdVar2 + lVar5;
      local_e8 = (long)lda;
      local_d8 = (TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
                  *)&local_100;
      local_f8 = lVar15;
      local_f0 = lVar15;
      local_d0 = local_a0;
      local_c8 = lVar15;
      local_b8 = local_e8;
      TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>::
      solveInPlace<1,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                (local_d8,(MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)&local_a0);
      iVar1 = *luptr;
      *luptr = (int)(iVar1 + lVar15);
      local_b0 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      uVar12 = (ulong)nrow;
      if ((nrow | segsize) < 0 && local_b0 != (double *)0x0) goto LAB_001577fc;
      local_b0 = local_b0 + iVar1 + lVar15;
      u._16_8_ = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      pdVar2 = (double *)(u._16_8_ + lVar15 * 8);
      uVar10 = 0;
      if (((ulong)local_b0 & 7) == 0) {
        uVar10 = (((int)local_b0 << 0x1c) >> 0x1f) + 2;
      }
      uVar4 = uVar10 - 2;
      if (uVar10 < 2) {
        uVar4 = uVar10;
      }
      uVar11 = 2;
      if (((ulong)pdVar2 & 7) == 0) {
        uVar11 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
      }
      if (nrow < -2) goto LAB_0015781b;
      if (-1 < nrow) {
        lVar5 = (long)(int)uVar4;
        pdVar2 = pdVar2 + uVar11 + lVar5;
        uVar7 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
        if (uVar12 <= uVar7) {
          uVar7 = uVar12;
        }
        if (((ulong)pdVar2 & 7) != 0) {
          uVar7 = uVar12;
        }
        uVar8 = uVar12 - uVar7;
        lVar13 = (long)((int)(((uint)(uVar8 >> 0x1f) & 1) + (int)uVar8) >> 1);
        if (uVar7 != 0) {
          memset(pdVar2,0,uVar7 * 8);
        }
        lVar14 = lVar13 * 2 + uVar7;
        if (1 < (long)uVar8) {
          lVar6 = uVar7 + 2;
          if ((long)(uVar7 + 2) < lVar14) {
            lVar6 = lVar14;
          }
          local_a8 = lVar14;
          memset((void *)(u._16_8_ + (lVar5 + lVar15 + uVar11 + uVar7) * 8),0,
                 (~uVar7 + lVar6 & 0xfffffffffffffffe) * 8 + 0x10);
          lVar14 = local_a8;
        }
        if (lVar14 < (long)uVar12) {
          memset(pdVar2 + lVar13 * 2 + uVar7,0,(uVar8 + lVar13 * -2) * 8);
        }
        sparselu_gemm<double,long>
                  (uVar12,1,lVar15,local_b0,local_b8,local_a0,u._0_8_,pdVar2,
                   (long)(int)((nrow - (nrow + 1 >> 0x1f)) + 1U & 0xfffffffe));
        if (segsize != 0) {
          pdVar2 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_data;
          uVar12 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_rows;
          uVar7 = 0;
          if ((long)uVar12 < 1) {
            uVar12 = uVar7;
          }
          lVar13 = *(long *)&dense->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ;
          piVar3 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          do {
            if ((iVar17 < 0) ||
               ((lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)(lVar16 + uVar7))) goto LAB_001577c6;
            if (uVar12 == uVar7) goto LAB_001577dd;
            lVar14 = (long)piVar3[lVar16 + uVar7];
            if ((lVar14 < 0) ||
               (*(long *)&(dense->
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                          ).field_0x8 <= lVar14)) goto LAB_001577af;
            *(double *)(lVar13 + lVar14 * 8) = pdVar2[uVar7];
            uVar7 = uVar7 + 1;
          } while ((uint)segsize != uVar7);
          iVar17 = iVar17 + (int)uVar7;
        }
        if (nrow != 0) {
          lVar16 = *(long *)&dense->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ;
          piVar3 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar12 = 0;
          do {
            if ((iVar17 < 0) ||
               ((lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)((long)iVar17 + uVar12))) goto LAB_001577c6;
            lVar13 = (long)piVar3[(long)iVar17 + uVar12];
            if ((lVar13 < 0) ||
               (*(long *)&(dense->
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                          ).field_0x8 <= lVar13)) goto LAB_001577af;
            *(double *)(lVar16 + lVar13 * 8) =
                 *(double *)(lVar16 + lVar13 * 8) -
                 *(double *)(u._16_8_ + lVar15 * 8 + uVar11 * 8 + lVar5 * 8 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while ((uint)nrow != uVar12);
        }
        return;
      }
      pcVar9 = 
      "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>, 0, Eigen::OuterStride<>>, Level = 0]"
      ;
    }
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                  ,0x8a,pcVar9);
  }
LAB_001577fc:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                ,0x94,
                "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
               );
LAB_001577dd:
  pcVar9 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
  ;
  goto LAB_001577f2;
LAB_001577c6:
  pcVar9 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
  goto LAB_001577f2;
LAB_001577af:
  pcVar9 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
  ;
LAB_001577f2:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,pcVar9);
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<SegSizeAtCompileTime>::run(const int segsize, BlockScalarVector& dense, ScalarVector& tempv, ScalarVector& lusup, Index& luptr, const Index lda,
                                                                  const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  // First, copy U[*,j] segment from dense(*) to tempv(*)
  // The result of triangular solve is in tempv[*]; 
    // The result of matric-vector update is in dense[*]
  Index isub = lptr + no_zeros; 
  int i;
  Index irow;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub); 
    tempv(i) = dense(irow); 
    ++isub; 
  }
  // Dense triangular solve -- start effective triangle
  luptr += lda * no_zeros + no_zeros; 
  // Form Eigen matrix and vector 
  Map<Matrix<Scalar,SegSizeAtCompileTime,SegSizeAtCompileTime>, 0, OuterStride<> > A( &(lusup.data()[luptr]), segsize, segsize, OuterStride<>(lda) );
  Map<Matrix<Scalar,SegSizeAtCompileTime,1> > u(tempv.data(), segsize);
  
  u = A.template triangularView<UnitLower>().solve(u); 
  
  // Dense matrix-vector product y <-- B*x 
  luptr += segsize;
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  Index ldl = internal::first_multiple(nrow, PacketSize);
  Map<Matrix<Scalar,Dynamic,SegSizeAtCompileTime>, 0, OuterStride<> > B( &(lusup.data()[luptr]), nrow, segsize, OuterStride<>(lda) );
  Index aligned_offset = internal::first_aligned(tempv.data()+segsize, PacketSize);
  Index aligned_with_B_offset = (PacketSize-internal::first_aligned(B.data(), PacketSize))%PacketSize;
  Map<Matrix<Scalar,Dynamic,1>, 0, OuterStride<> > l(tempv.data()+segsize+aligned_offset+aligned_with_B_offset, nrow, OuterStride<>(ldl) );
  
  l.setZero();
  internal::sparselu_gemm<Scalar>(l.rows(), l.cols(), B.cols(), B.data(), B.outerStride(), u.data(), u.outerStride(), l.data(), l.outerStride());
  
  // Scatter tempv[] into SPA dense[] as a temporary storage 
  isub = lptr + no_zeros;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub++); 
    dense(irow) = tempv(i);
  }
  
  // Scatter l into SPA dense[]
  for (i = 0; i < nrow; i++)
  {
    irow = lsub(isub++); 
    dense(irow) -= l(i);
  } 
}